

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pointer __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
::alloc_impl<google::libc_allocator_with_realloc<const_char_*>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<const_char_*>_> *this,pointer ptr,
          size_type n)

{
  pointer ppcVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  pointer retval;
  pointer in_stack_ffffffffffffffd8;
  libc_allocator_with_realloc<const_char_*> *in_stack_ffffffffffffffe0;
  
  ppcVar1 = libc_allocator_with_realloc<const_char_*>::reallocate
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x10bd177);
  if (ppcVar1 == (pointer)0x0) {
    fprintf(_stderr,"sparsehash: FATAL ERROR: failed to reallocate %lu elements for ptr %p",in_RDX,
            in_RSI);
    exit(1);
  }
  return ppcVar1;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }